

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__start_file(stbi__context *s,FILE *f)

{
  stbi__context *in_RSI;
  stbi_io_callbacks *in_stack_ffffffffffffffe8;
  
  stbi__start_callbacks(in_RSI,in_stack_ffffffffffffffe8,(void *)0x27ddf4);
  return;
}

Assistant:

static void stbi__start_file(stbi__context *s, FILE *f)
{
   stbi__start_callbacks(s, &stbi__stdio_callbacks, (void *) f);
}